

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O3

bool __thiscall SymbolTable::isActive(SymbolTable *this,string *name,string *curFun)

{
  pointer pvVar1;
  pointer pSVar2;
  size_t sVar3;
  byte bVar4;
  int iVar5;
  mapped_type *pmVar6;
  SymbolTableElement *i;
  pointer pSVar7;
  
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->funToName,curFun);
  pvVar1 = (this->symbolTable).
           super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar7 = *(pointer *)
            &pvVar1[*pmVar6].
             super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>._M_impl;
  pSVar2 = *(pointer *)
            ((long)&pvVar1[*pmVar6].
                    super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>.
                    _M_impl.super__Vector_impl_data + 8);
  if (pSVar7 != pSVar2) {
    sVar3 = name->_M_string_length;
    do {
      if ((pSVar7->name)._M_string_length == sVar3) {
        if (sVar3 == 0) goto LAB_00119502;
        iVar5 = bcmp((pSVar7->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,sVar3);
        if (iVar5 == 0) goto LAB_00119502;
      }
      pSVar7 = pSVar7 + 1;
    } while (pSVar7 != pSVar2);
  }
  pSVar7 = (pvVar1->super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pSVar2 = *(pointer *)
            ((long)&(pvVar1->
                    super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>).
                    _M_impl.super__Vector_impl_data + 8);
  if (pSVar7 != pSVar2) {
    sVar3 = name->_M_string_length;
    do {
      if ((pSVar7->name)._M_string_length == sVar3) {
        if (sVar3 == 0) goto LAB_00119502;
        iVar5 = bcmp((pSVar7->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,sVar3);
        if (iVar5 == 0) goto LAB_00119502;
      }
      pSVar7 = pSVar7 + 1;
    } while (pSVar7 != pSVar2);
  }
  bVar4 = 0;
LAB_00119506:
  return (bool)(bVar4 & 1);
LAB_00119502:
  bVar4 = pSVar7->isActive;
  goto LAB_00119506;
}

Assistant:

bool SymbolTable::isActive(string name, string curFun) {
    int index = funToName[curFun];
    for (auto &i : symbolTable[index]) {
        if(i.name == name) {
            return i.isActive;
        }
    }
    for (auto &i : symbolTable[0]) {
        if(i.name == name) {
            return i.isActive;
        }
    }

//    cout << "未找到该变量" << endl;
    return false;
}